

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

JsonObjectVector<cfd::js::api::json::ElementsDecodeRawTransactionTxIn,cfd::js::api::ElementsDecodeRawTransactionTxInStruct>
* __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::ElementsDecodeRawTransactionTxIn,cfd::js::api::ElementsDecodeRawTransactionTxInStruct>
::Serialize_abi_cxx11_
          (JsonObjectVector<cfd::js::api::json::ElementsDecodeRawTransactionTxIn,cfd::js::api::ElementsDecodeRawTransactionTxInStruct>
           *this)

{
  bool bVar1;
  bool bVar2;
  reference pEVar3;
  reference pbVar4;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item_1;
  iterator __end3;
  iterator __begin3;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  bool is_first;
  value_type local_78 [8];
  string item;
  ElementsDecodeRawTransactionTxIn *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonObjectVector<cfd::js::api::json::ElementsDecodeRawTransactionTxIn,_cfd::js::api::ElementsDecodeRawTransactionTxInStruct>
  *__range3;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_list;
  JsonObjectVector<cfd::js::api::json::ElementsDecodeRawTransactionTxIn,_cfd::js::api::ElementsDecodeRawTransactionTxInStruct>
  *this_local;
  string *result;
  
  str_list.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size._7_1_ = 0;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&__range3);
  __end0 = std::
           vector<cfd::js::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::js::api::json::ElementsDecodeRawTransactionTxIn>_>
           ::begin((vector<cfd::js::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::js::api::json::ElementsDecodeRawTransactionTxIn>_>
                    *)(in_RSI + 8));
  element = (ElementsDecodeRawTransactionTxIn *)
            std::
            vector<cfd::js::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::js::api::json::ElementsDecodeRawTransactionTxIn>_>
            ::end((vector<cfd::js::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::js::api::json::ElementsDecodeRawTransactionTxIn>_>
                   *)(in_RSI + 8));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_cfd::js::api::json::ElementsDecodeRawTransactionTxIn_*,_std::vector<cfd::js::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::js::api::json::ElementsDecodeRawTransactionTxIn>_>_>
                                *)&element);
    if (!bVar1) break;
    pEVar3 = __gnu_cxx::
             __normal_iterator<const_cfd::js::api::json::ElementsDecodeRawTransactionTxIn_*,_std::vector<cfd::js::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::js::api::json::ElementsDecodeRawTransactionTxIn>_>_>
             ::operator*(&__end0);
    (*(pEVar3->super_JsonClassBase<cfd::js::api::json::ElementsDecodeRawTransactionTxIn>).
      _vptr_JsonClassBase[6])(local_78);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range3,local_78);
    std::__cxx11::string::~string((string *)local_78);
    __gnu_cxx::
    __normal_iterator<const_cfd::js::api::json::ElementsDecodeRawTransactionTxIn_*,_std::vector<cfd::js::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::js::api::json::ElementsDecodeRawTransactionTxIn>_>_>
    ::operator++(&__end0);
  }
  std::__cxx11::string::operator=((string *)this,"[");
  bVar1 = true;
  __end3 = std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range3);
  item_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range3);
  while( true ) {
    bVar2 = std::operator!=(&__end3,(_Self *)&item_1);
    if (!bVar2) break;
    pbVar4 = std::
             _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end3);
    if (!bVar1) {
      std::__cxx11::string::operator+=((string *)this,",");
    }
    std::__cxx11::string::operator+=((string *)this,(string *)pbVar4);
    bVar1 = false;
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end3);
  }
  std::__cxx11::string::operator+=((string *)this,"]");
  str_list.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size._7_1_ = 1;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&__range3);
  if ((str_list.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node._M_size._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)this);
  }
  return this;
}

Assistant:

virtual std::string Serialize() const {
    std::string result;
    std::list<std::string> str_list;
    for (auto& element : *this) {
      std::string item = element.Serialize();
      str_list.push_back(item);
    }

    result = "[";
    bool is_first = true;
    for (const auto& item : str_list) {
      if (!is_first) {
        result += ",";
      }
      result += item;
      is_first = false;
    }
    result += "]";

    return result;
  }